

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDPmxParser.h
# Opt level: O2

void __thiscall pmx::PmxMorphBoneOffset::PmxMorphBoneOffset(PmxMorphBoneOffset *this)

{
  int i;
  long lVar1;
  
  (this->super_PmxMorphOffset)._vptr_PmxMorphOffset = (_func_int **)&PTR_Read_0082cde0;
  this->bone_index = 0;
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    this->translation[lVar1] = 0.0;
  }
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    this->rotation[lVar1] = 0.0;
  }
  return;
}

Assistant:

PmxMorphBoneOffset()
			: bone_index(0)
		{
			for (int i = 0; i < 3; ++i) {
				translation[i] = 0.0f;
			}
			for (int i = 0; i < 4; ++i) {
				rotation[i] = 0.0f;
			}
		}